

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_class_closure(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim,ClassId class_id)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> eq_marks;
  Write<signed_char> local_30;
  
  if (ent_dim <= class_dim) {
    mark_by_class((Omega_h *)&eq_marks,mesh,class_dim,class_dim,class_id);
    if (ent_dim == class_dim) {
      Write<signed_char>::Write((Write<signed_char> *)this,&eq_marks.write_);
    }
    else {
      Write<signed_char>::Write(&local_30,&eq_marks.write_);
      mark_down(this,mesh,class_dim,ent_dim,(Read<signed_char> *)&local_30);
      Write<signed_char>::~Write(&local_30);
    }
    Write<signed_char>::~Write(&eq_marks.write_);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","ent_dim <= class_dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0x68);
}

Assistant:

Read<I8> mark_class_closure(
    Mesh* mesh, Int ent_dim, Int class_dim, ClassId class_id) {
  OMEGA_H_CHECK(ent_dim <= class_dim);
  auto eq_marks = mark_by_class(mesh, class_dim, class_dim, class_id);
  if (ent_dim == class_dim) return eq_marks;
  return mark_down(mesh, class_dim, ent_dim, eq_marks);
}